

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall TPZEqnArray<float>::EndEquation(TPZEqnArray<float> *this)

{
  undefined8 in_RDI;
  
  TPZStack<int,_100>::Push((TPZStack<int,_100> *)this,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void TPZEqnArray<TVar>::EndEquation() {
	fEqStart.Push(fLastTerm);
}